

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>::dispose
          (Own<capnp::JsonCodec::AnnotatedEnumHandler> *this)

{
  AnnotatedEnumHandler *this_00;
  Disposer *in_RDX;
  
  this_00 = this->ptr;
  if (this_00 != (AnnotatedEnumHandler *)0x0) {
    this->ptr = (AnnotatedEnumHandler *)0x0;
    Disposer::Dispose_<capnp::JsonCodec::AnnotatedEnumHandler,_true>::dispose
              ((Dispose_<capnp::JsonCodec::AnnotatedEnumHandler,_true> *)this_00,
               (AnnotatedEnumHandler *)this->disposer,in_RDX);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }